

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EnumMethods.cpp
# Opt level: O2

void __thiscall slang::ast::builtins::Builtins::registerEnumMethods(Builtins *this)

{
  bool local_8c [4];
  undefined1 local_88 [40];
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_60;
  shared_ptr<slang::ast::SystemSubroutine> local_58;
  shared_ptr<slang::ast::SystemSubroutine> local_48;
  shared_ptr<slang::ast::SystemSubroutine> local_38;
  shared_ptr<slang::ast::SystemSubroutine> local_28;
  
  local_8c[0] = true;
  local_8c[1] = true;
  local_8c[2] = false;
  local_8c[3] = false;
  std::make_shared<slang::ast::builtins::EnumFirstLastMethod,slang::parsing::KnownSystemName,bool>
            ((KnownSystemName *)local_88,local_8c);
  local_28.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_88._0_8_;
  local_28.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_88._8_8_;
  local_88._0_8_ = (element_type *)0x0;
  local_88._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  addSystemMethod(this,EnumType,&local_28);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_28.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_88 + 8));
  local_8c[0] = true;
  local_8c[1] = true;
  local_8c[2] = false;
  local_8c[3] = false;
  std::make_shared<slang::ast::builtins::EnumFirstLastMethod,slang::parsing::KnownSystemName,bool>
            ((KnownSystemName *)local_88,local_8c);
  local_38.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_88._0_8_;
  local_38.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_88._8_8_;
  local_88._0_8_ = (Type *)0x0;
  local_88._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  addSystemMethod(this,EnumType,&local_38);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_38.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_88 + 8));
  local_8c[0] = true;
  local_8c[1] = true;
  local_8c[2] = false;
  local_8c[3] = false;
  std::make_shared<slang::ast::builtins::EnumNextPrevMethod,slang::parsing::KnownSystemName,bool>
            ((KnownSystemName *)local_88,local_8c);
  local_48.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_88._0_8_;
  local_48.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_88._8_8_;
  local_88._0_8_ = (element_type *)0x0;
  local_88._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  addSystemMethod(this,EnumType,&local_48);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_48.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_88 + 8));
  local_8c[0] = true;
  local_8c[1] = true;
  local_8c[2] = false;
  local_8c[3] = false;
  std::make_shared<slang::ast::builtins::EnumNextPrevMethod,slang::parsing::KnownSystemName,bool>
            ((KnownSystemName *)local_88,local_8c);
  local_58.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_88._0_8_;
  local_58.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_88._8_8_;
  local_88._0_8_ = (Scope *)0x0;
  local_88._8_8_ = (Symbol *)0x0;
  addSystemMethod(this,EnumType,&local_58);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_58.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_88 + 8));
  std::make_shared<slang::ast::builtins::EnumNameMethod,slang::ast::builtins::Builtins&>
            ((Builtins *)local_88);
  local_88._32_8_ = local_88._0_8_;
  _Stack_60._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_88._8_8_;
  local_88._0_8_ = (char *)0x0;
  local_88._8_8_ = (SourceLocation)0x0;
  addSystemMethod(this,EnumType,(shared_ptr<slang::ast::SystemSubroutine> *)(local_88 + 0x20));
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_60);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_88 + 8));
  std::make_shared<slang::ast::builtins::EnumNumMethod>();
  local_88._16_8_ = local_88._0_8_;
  local_88._24_8_ = local_88._8_8_;
  local_88._0_8_ = 0;
  local_88._8_8_ = 0;
  addSystemMethod(this,EnumType,(shared_ptr<slang::ast::SystemSubroutine> *)(local_88 + 0x10));
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_88 + 0x18));
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_88 + 8));
  return;
}

Assistant:

void Builtins::registerEnumMethods() {
    using parsing::KnownSystemName;

#define REGISTER(kind, name, ...) addSystemMethod(kind, std::make_shared<name##Method>(__VA_ARGS__))
    REGISTER(SymbolKind::EnumType, EnumFirstLast, KnownSystemName::First, true);
    REGISTER(SymbolKind::EnumType, EnumFirstLast, KnownSystemName::Last, false);
    REGISTER(SymbolKind::EnumType, EnumNextPrev, KnownSystemName::Next, true);
    REGISTER(SymbolKind::EnumType, EnumNextPrev, KnownSystemName::Prev, false);
    REGISTER(SymbolKind::EnumType, EnumName, *this);
#undef REGISTER

    addSystemMethod(SymbolKind::EnumType, std::make_shared<EnumNumMethod>());
}